

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

uhugeint_t __thiscall duckdb::BaseUUID::ToUHugeint(BaseUUID *this,hugeint_t input)

{
  uhugeint_t uVar1;
  
  uVar1.upper = input.lower ^ 0x8000000000000000;
  uVar1.lower = (uint64_t)this;
  return uVar1;
}

Assistant:

uhugeint_t BaseUUID::ToUHugeint(hugeint_t input) {
	uhugeint_t result;
	result.lower = input.lower;
	if (input.upper >= 0) {
		result.upper = uint64_t(input.upper) + uint64_t(NumericLimits<int64_t>::Maximum()) + 1;
	} else {
		result.upper = uint64_t(input.upper + NumericLimits<int64_t>::Maximum() + 1);
	}
	return result;
}